

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_options_common<char>::basic_json_options_common
          (basic_json_options_common<char> *this,basic_json_options_common<char> *param_1)

{
  this->_vptr_basic_json_options_common = (_func_int **)&PTR__basic_json_options_common_00997ba0;
  *(undefined2 *)&this->field_0x8 = *(undefined2 *)&param_1->field_0x8;
  std::__cxx11::string::string((string *)&this->nan_to_num_,(string *)&param_1->nan_to_num_);
  std::__cxx11::string::string((string *)&this->inf_to_num_,(string *)&param_1->inf_to_num_);
  std::__cxx11::string::string((string *)&this->neginf_to_num_,(string *)&param_1->neginf_to_num_);
  std::__cxx11::string::string((string *)&this->nan_to_str_,(string *)&param_1->nan_to_str_);
  std::__cxx11::string::string((string *)&this->inf_to_str_,(string *)&param_1->inf_to_str_);
  std::__cxx11::string::string((string *)&this->neginf_to_str_,(string *)&param_1->neginf_to_str_);
  this->max_nesting_depth_ = param_1->max_nesting_depth_;
  return;
}

Assistant:

basic_json_options_common(const basic_json_options_common&) = default;